

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_solver.cc
# Opt level: O2

void __thiscall ipx::LpSolver::RunInitialIPM(LpSolver *this,IPM *ipm)

{
  int iVar1;
  ipxint *piVar2;
  int iVar3;
  double dVar4;
  Timer timer;
  KKTSolverDiag kkt;
  
  Timer::Timer(&timer);
  KKTSolverDiag::KKTSolverDiag(&kkt,&this->control_,&this->model_);
  iVar3 = (this->control_).parameters_.super_ipx_parameters.switchiter;
  if (iVar3 < 0) {
    iVar1 = (this->model_).num_rows_ / 0x14;
    iVar3 = 0x1ea;
    if (iVar1 < 0x1ea) {
      iVar3 = iVar1;
    }
    kkt.maxiter_ = iVar3 + 10;
    iVar3 = (this->control_).parameters_.super_ipx_parameters.ipm_maxiter;
  }
  else {
    iVar1 = (this->control_).parameters_.super_ipx_parameters.ipm_maxiter;
    if (iVar1 < iVar3) {
      iVar3 = iVar1;
    }
  }
  ipm->maxiter_ = iVar3;
  IPM::Driver(ipm,&kkt.super_KKTSolver,
              (this->iterate_)._M_t.
              super___uniq_ptr_impl<ipx::Iterate,_std::default_delete<ipx::Iterate>_>._M_t.
              super__Tuple_impl<0UL,_ipx::Iterate_*,_std::default_delete<ipx::Iterate>_>.
              super__Head_base<0UL,_ipx::Iterate_*,_false>._M_head_impl,&this->info_);
  iVar3 = (this->info_).super_ipx_info.status_ipm;
  if (iVar3 - 1U < 9) {
    piVar2 = &(this->info_).super_ipx_info.status_ipm;
    switch(iVar3) {
    case 1:
    case 8:
      break;
    default:
      goto switchD_00383ba0_caseD_2;
    case 7:
      if ((this->control_).parameters_.super_ipx_parameters.ipm_maxiter <=
          (this->info_).super_ipx_info.iter) goto switchD_00383ba0_caseD_2;
      break;
    case 9:
      (this->info_).super_ipx_info.status_ipm = 0;
      piVar2 = &(this->info_).super_ipx_info.errflag;
    }
    *piVar2 = 0;
  }
switchD_00383ba0_caseD_2:
  dVar4 = Timer::Elapsed(&timer);
  (this->info_).super_ipx_info.time_ipm1 = dVar4 + (this->info_).super_ipx_info.time_ipm1;
  KKTSolverDiag::~KKTSolverDiag(&kkt);
  return;
}

Assistant:

void LpSolver::RunInitialIPM(IPM& ipm) {
    Timer timer;
    KKTSolverDiag kkt(control_, model_);

    Int switchiter = control_.switchiter();
    if (switchiter < 0) {
        // Switch iteration not specified by user. Run as long as KKT solver
        // converges within min(500,10+m/20) iterations.
        Int m = model_.rows();
        kkt.maxiter(std::min(500l, (long) (10+m/20) ));
        ipm.maxiter(control_.ipm_maxiter());
    } else {
        ipm.maxiter(std::min(switchiter, control_.ipm_maxiter()));
    }
    ipm.Driver(&kkt, iterate_.get(), &info_);
    switch (info_.status_ipm) {
    case IPX_STATUS_optimal:
        // If the IPM reached its termination criterion in the initial
        // iterations (happens rarely), we still call the IPM again with basis
        // preconditioning. In exact arithmetic it would terminate without an
        // additional iteration. A starting basis is then available for
        // crossover.
        info_.status_ipm = IPX_STATUS_not_run;
        break;
    case IPX_STATUS_no_progress:
        info_.status_ipm = IPX_STATUS_not_run;
        break;
    case IPX_STATUS_failed:
        info_.status_ipm = IPX_STATUS_not_run;
        info_.errflag = 0;
        break;
    case IPX_STATUS_iter_limit:
        if (info_.iter < control_.ipm_maxiter()) // stopped at switchiter
            info_.status_ipm = IPX_STATUS_not_run;
    }
    info_.time_ipm1 += timer.Elapsed();
}